

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

void __thiscall spdlog::details::file_helper::flush(file_helper *this)

{
  int iVar1;
  int *piVar2;
  os local_50 [32];
  string local_30 [32];
  file_helper *local_10;
  file_helper *this_local;
  
  local_10 = this;
  iVar1 = fflush((FILE *)this->fd_);
  if (iVar1 != 0) {
    os::filename_to_str(local_50,&this->filename_);
    std::operator+((char *)local_30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Failed flush to file ");
    piVar2 = __errno_location();
    throw_spdlog_ex(local_30,*piVar2);
  }
  return;
}

Assistant:

SPDLOG_INLINE void file_helper::flush() {
    if (std::fflush(fd_) != 0) {
        throw_spdlog_ex("Failed flush to file " + os::filename_to_str(filename_), errno);
    }
}